

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::emit_trinary_func_op_cast
          (CompilerGLSL *this,uint32_t result_type,uint32_t result_id,uint32_t op0,uint32_t op1,
          uint32_t op2,char *op,BaseType input_type)

{
  bool bVar1;
  SPIRType *pSVar2;
  uint32_t id;
  bool local_2ad;
  spirv_cross local_270 [32];
  spirv_cross local_250 [32];
  string local_230 [32];
  string local_210 [8];
  string expr;
  undefined1 local_1f0 [8];
  string cast_op2;
  undefined1 local_1d0 [8];
  string cast_op1;
  undefined1 local_1a0 [8];
  string cast_op0;
  undefined1 local_180 [8];
  SPIRType expected_type;
  SPIRType *out_type;
  uint32_t op2_local;
  uint32_t op1_local;
  uint32_t op0_local;
  uint32_t result_id_local;
  uint32_t result_type_local;
  CompilerGLSL *this_local;
  
  expected_type.member_name_cache._M_h._M_single_bucket =
       (__node_base_ptr)Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,result_type);
  SPIRType::SPIRType((SPIRType *)local_180,
                     (SPIRType *)expected_type.member_name_cache._M_h._M_single_bucket);
  expected_type.super_IVariant._vptr_IVariant._4_4_ = input_type;
  pSVar2 = Compiler::expression_type(&this->super_Compiler,op0);
  id = (uint32_t)this;
  if (*(BaseType *)&(pSVar2->super_IVariant).field_0xc == input_type) {
    to_unpacked_expression_abi_cxx11_((CompilerGLSL *)local_1a0,id,SUB41(op0,0));
  }
  else {
    bitcast_glsl_abi_cxx11_((CompilerGLSL *)local_1a0,(SPIRType *)this,(uint32_t)local_180);
  }
  pSVar2 = Compiler::expression_type(&this->super_Compiler,op1);
  if (*(BaseType *)&(pSVar2->super_IVariant).field_0xc == input_type) {
    to_unpacked_expression_abi_cxx11_((CompilerGLSL *)local_1d0,id,SUB41(op1,0));
  }
  else {
    bitcast_glsl_abi_cxx11_((CompilerGLSL *)local_1d0,(SPIRType *)this,(uint32_t)local_180);
  }
  pSVar2 = Compiler::expression_type(&this->super_Compiler,op2);
  if (*(BaseType *)&(pSVar2->super_IVariant).field_0xc == input_type) {
    to_unpacked_expression_abi_cxx11_((CompilerGLSL *)local_1f0,id,SUB41(op2,0));
  }
  else {
    bitcast_glsl_abi_cxx11_((CompilerGLSL *)local_1f0,(SPIRType *)this,(uint32_t)local_180);
  }
  ::std::__cxx11::string::string(local_210);
  if (*(BaseType *)((long)&expected_type.member_name_cache._M_h._M_single_bucket[1]._M_nxt + 4) ==
      input_type) {
    join<char_const*&,char_const(&)[2],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string&,char_const(&)[2]>
              (local_270,&op,(char (*) [2])0x4f3f9c,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0,
               (char (*) [3])0x4f06f8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0,
               (char (*) [3])0x4f06f8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f0,
               (char (*) [2])0x4dff7a);
    ::std::__cxx11::string::operator+=(local_210,(string *)local_270);
    ::std::__cxx11::string::~string((string *)local_270);
  }
  else {
    (*(this->super_Compiler)._vptr_Compiler[0x34])
              (local_230,this,expected_type.member_name_cache._M_h._M_single_bucket,local_180);
    ::std::__cxx11::string::operator=(local_210,local_230);
    ::std::__cxx11::string::~string(local_230);
    ::std::__cxx11::string::operator+=(local_210,'(');
    join<char_const*&,char_const(&)[2],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string&,char_const(&)[2]>
              (local_250,&op,(char (*) [2])0x4f3f9c,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0,
               (char (*) [3])0x4f06f8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0,
               (char (*) [3])0x4f06f8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f0,
               (char (*) [2])0x4dff7a);
    ::std::__cxx11::string::operator+=(local_210,(string *)local_250);
    ::std::__cxx11::string::~string((string *)local_250);
    ::std::__cxx11::string::operator+=(local_210,')');
  }
  bVar1 = should_forward(this,op0);
  local_2ad = false;
  if (bVar1) {
    bVar1 = should_forward(this,op1);
    local_2ad = false;
    if (bVar1) {
      local_2ad = should_forward(this,op2);
    }
  }
  emit_op(this,result_type,result_id,(string *)local_210,local_2ad,false);
  Compiler::inherit_expression_dependencies(&this->super_Compiler,result_id,op0);
  Compiler::inherit_expression_dependencies(&this->super_Compiler,result_id,op1);
  Compiler::inherit_expression_dependencies(&this->super_Compiler,result_id,op2);
  ::std::__cxx11::string::~string(local_210);
  ::std::__cxx11::string::~string((string *)local_1f0);
  ::std::__cxx11::string::~string((string *)local_1d0);
  ::std::__cxx11::string::~string((string *)local_1a0);
  SPIRType::~SPIRType((SPIRType *)local_180);
  return;
}

Assistant:

void CompilerGLSL::emit_trinary_func_op_cast(uint32_t result_type, uint32_t result_id, uint32_t op0, uint32_t op1,
                                             uint32_t op2, const char *op, SPIRType::BaseType input_type)
{
	auto &out_type = get<SPIRType>(result_type);
	auto expected_type = out_type;
	expected_type.basetype = input_type;
	string cast_op0 =
	    expression_type(op0).basetype != input_type ? bitcast_glsl(expected_type, op0) : to_unpacked_expression(op0);
	string cast_op1 =
	    expression_type(op1).basetype != input_type ? bitcast_glsl(expected_type, op1) : to_unpacked_expression(op1);
	string cast_op2 =
	    expression_type(op2).basetype != input_type ? bitcast_glsl(expected_type, op2) : to_unpacked_expression(op2);

	string expr;
	if (out_type.basetype != input_type)
	{
		expr = bitcast_glsl_op(out_type, expected_type);
		expr += '(';
		expr += join(op, "(", cast_op0, ", ", cast_op1, ", ", cast_op2, ")");
		expr += ')';
	}
	else
	{
		expr += join(op, "(", cast_op0, ", ", cast_op1, ", ", cast_op2, ")");
	}

	emit_op(result_type, result_id, expr, should_forward(op0) && should_forward(op1) && should_forward(op2));
	inherit_expression_dependencies(result_id, op0);
	inherit_expression_dependencies(result_id, op1);
	inherit_expression_dependencies(result_id, op2);
}